

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_win_part(ggml_context *ctx,ggml_tensor *a,int w)

{
  ggml_tensor *tensor;
  char *pcVar1;
  int iVar2;
  int iVar3;
  int32_t params [3];
  int64_t ne [4];
  
  if (a->ne[3] == 1) {
    if (a->type == GGML_TYPE_F32) {
      ne[1] = (int64_t)w;
      ne[0] = a->ne[0];
      iVar2 = (int)(((ne[1] - a->ne[1] % ne[1]) % ne[1] + a->ne[1]) / ne[1]);
      iVar3 = (int)(((ne[1] - a->ne[2] % ne[1]) % ne[1] + a->ne[2]) / ne[1]);
      ne[3] = (int64_t)(iVar2 * iVar3);
      ne[2] = ne[1];
      tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
      params[0] = iVar2;
      params[1] = iVar3;
      params[2] = w;
      ggml_set_op_params(tensor,params,0xc);
      tensor->op = GGML_OP_WIN_PART;
      tensor->src[0] = a;
      return tensor;
    }
    pcVar1 = "a->type == GGML_TYPE_F32";
    iVar2 = 0x1206;
  }
  else {
    pcVar1 = "a->ne[3] == 1";
    iVar2 = 0x1205;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",iVar2,
             "GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

struct ggml_tensor * ggml_win_part(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w) {
    GGML_ASSERT(a->ne[3] == 1);
    GGML_ASSERT(a->type  == GGML_TYPE_F32);

    // padding
    const int px = (w - a->ne[1]%w)%w;
    const int py = (w - a->ne[2]%w)%w;

    const int npx = (px + a->ne[1])/w;
    const int npy = (py + a->ne[2])/w;
    const int np  = npx*npy;

    const int64_t ne[4] = { a->ne[0], w, w, np, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { npx, npy, w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_PART;
    result->src[0] = a;

    return result;
}